

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteExistsCollection(unqlite_vm *pVm,SyString *pName)

{
  unqlite_col *puVar1;
  int rc;
  unqlite_col *pCol;
  SyString *pName_local;
  unqlite_vm *pVm_local;
  
  puVar1 = unqliteVmFetchCollection(pVm,pName);
  if (puVar1 == (unqlite_col *)0x0) {
    pVm_local._4_4_ = unqliteVmLoadCollection(pVm,pName->zString,pName->nByte,2,(unqlite_col **)0x0)
    ;
  }
  else {
    pVm_local._4_4_ = 0;
  }
  return pVm_local._4_4_;
}

Assistant:

UNQLITE_PRIVATE int unqliteExistsCollection(
    unqlite_vm *pVm, /* Target VM */
    SyString *pName  /* Collection name */
    )
{
    unqlite_col *pCol;
    int rc;
    /* Perform a lookup first */
    pCol = unqliteVmFetchCollection(pVm,pName);
    if( pCol ){
        /* Already loaded in memory*/
        return UNQLITE_OK;
    }
    rc = unqliteVmLoadCollection(pVm,pName->zString,pName->nByte,UNQLITE_VM_COLLECTION_EXISTS,0);
    return rc;
}